

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_communicate.hpp
# Opt level: O1

void MPIX_intra_recv_map(comm_pkg *comm,char *intra_recv_data,void *inter_recv_data,
                        MPI_Datatype mpi_type,MPI_Comm mpi_comm)

{
  comm_data *pcVar1;
  long lVar2;
  int ctr;
  int type_size;
  int size;
  undefined4 local_3c;
  int local_38;
  undefined4 local_34;
  
  MPI_Type_size(mpi_type,&local_38);
  MPI_Pack_size(comm->recv_data->size_msgs,mpi_type,mpi_comm,&local_34);
  local_3c = 0;
  pcVar1 = comm->recv_data;
  if (0 < pcVar1->size_msgs) {
    lVar2 = 0;
    do {
      MPI_Unpack(intra_recv_data,local_34,&local_3c,
                 (void *)((long)local_38 * (long)pcVar1->indices[lVar2] + (long)inter_recv_data),1,
                 mpi_type,mpi_comm);
      lVar2 = lVar2 + 1;
      pcVar1 = comm->recv_data;
    } while (lVar2 < pcVar1->size_msgs);
  }
  return;
}

Assistant:

static void MPIX_intra_recv_map(comm_pkg* comm, char* intra_recv_data, void* inter_recv_data,
        MPI_Datatype mpi_type, MPI_Comm mpi_comm)
{
    int idx, addr;
    int size, type_size;
    char* char_ptr = reinterpret_cast<char*>(inter_recv_data);
    int* int_ptr = reinterpret_cast<int*>(inter_recv_data);
    MPI_Type_size(mpi_type, &type_size);
    MPI_Pack_size(comm->recv_data->size_msgs, mpi_type, mpi_comm, &size);

    int ctr = 0;
    for (int i = 0; i < comm->recv_data->size_msgs; i++)
    {
        idx = comm->recv_data->indices[i];
        MPI_Unpack(intra_recv_data, size, &ctr, &(char_ptr[idx*type_size]), 
                1, mpi_type, mpi_comm);
    }
}